

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ushort uVar2;
  uint16 *puVar3;
  uint32 *puVar4;
  uint32 i_1;
  uint uVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  uint *__s;
  byte bVar8;
  uint in_ECX;
  uint uVar9;
  long in_RDX;
  long lVar10;
  ulong uVar11;
  uint32 uVar12;
  uint32 code;
  uint32 uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint32 j;
  uint32 i_2;
  uint32 num_codes [17];
  int aiStack_c4 [3];
  uint32 min_codes [16];
  uint32 sorted_positions [17];
  uint uStack_34;
  
  uVar9 = (uint)ctx;
  if (in_ECX < 0xc && uVar9 != 0) {
    this->m_num_syms = uVar9;
    num_codes[0xc] = 0;
    num_codes[0xd] = 0;
    num_codes[0xe] = 0;
    num_codes[0xf] = 0;
    num_codes[8] = 0;
    num_codes[9] = 0;
    num_codes[10] = 0;
    num_codes[0xb] = 0;
    num_codes[0x10] = 0;
    num_codes[4] = 0;
    num_codes[5] = 0;
    num_codes[6] = 0;
    num_codes[7] = 0;
    num_codes[0] = 0;
    num_codes[1] = 0;
    num_codes[2] = 0;
    num_codes[3] = 0;
    for (uVar6 = 0; ((ulong)ctx & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      if ((ulong)*(byte *)(in_RDX + uVar6) != 0) {
        num_codes[*(byte *)(in_RDX + uVar6)] = num_codes[*(byte *)(in_RDX + uVar6)] + 1;
      }
    }
    uVar16 = 0;
    bVar8 = 0xf;
    uVar5 = 0xffffffff;
    uVar13 = 0;
    uVar12 = 0;
    for (lVar10 = -0x10; lVar10 != 0; lVar10 = lVar10 + 1) {
      iVar15 = aiStack_c4[lVar10];
      if (iVar15 == 0) {
        this->m_max_codes[lVar10 + 0x10] = 0;
      }
      else {
        uVar14 = (int)lVar10 + 0x11;
        if (uVar14 <= uVar5) {
          uVar5 = uVar14;
        }
        if (uVar16 <= uVar14) {
          uVar16 = uVar14;
        }
        iVar1 = iVar15 + uVar12;
        sorted_positions[lVar10] = uVar12;
        uVar12 = uVar12 + iVar15;
        this->m_max_codes[lVar10 + 0x10] =
             (~(-1 << (bVar8 & 0x1f)) | iVar1 + -1 << (bVar8 & 0x1f)) + 1;
        this->m_val_ptrs[lVar10 + 0x10] = uVar13;
        (&uStack_34)[lVar10] = uVar13;
        uVar13 = iVar15 + uVar13;
      }
      uVar12 = uVar12 * 2;
      bVar8 = bVar8 - 1;
    }
    this->m_total_used_syms = uVar13;
    if (this->m_cur_sorted_symbol_order_size < uVar13) {
      this->m_cur_sorted_symbol_order_size = uVar13;
      if ((uVar13 & uVar13 - 1) != 0) {
        uVar13 = math::next_pow2(uVar13);
        if (uVar9 < uVar13) {
          uVar13 = uVar9;
        }
        this->m_cur_sorted_symbol_order_size = uVar13;
      }
      if (this->m_sorted_symbol_order != (uint16 *)0x0) {
        crnd_free(this->m_sorted_symbol_order + -4);
        uVar13 = this->m_cur_sorted_symbol_order_size;
      }
      puVar7 = crnd_new_array<unsigned_short>(uVar13);
      this->m_sorted_symbol_order = puVar7;
      if (puVar7 == (unsigned_short *)0x0) goto LAB_0010eb23;
    }
    else {
      puVar7 = this->m_sorted_symbol_order;
    }
    this->m_min_code_size = (uint8)uVar5;
    this->m_max_code_size = (uint8)uVar16;
    for (uVar6 = 0; ((ulong)ctx & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      uVar11 = (ulong)*(byte *)(in_RDX + uVar6);
      if (uVar11 != 0) {
        uVar9 = sorted_positions[uVar11];
        sorted_positions[uVar11] = uVar9 + 1;
        puVar7[uVar9] = (unsigned_short)uVar6;
      }
    }
    uVar5 = uVar5 & 0xff;
    uVar9 = 0;
    if (uVar5 < in_ECX) {
      uVar9 = in_ECX;
    }
    this->m_table_bits = uVar9;
    if (uVar5 < in_ECX) {
      uVar13 = 1 << ((byte)in_ECX & 0x1f);
      if (this->m_cur_lookup_size < uVar13) {
        this->m_cur_lookup_size = uVar13;
        if (this->m_lookup != (uint32 *)0x0) {
          crnd_free(this->m_lookup + -2);
        }
        __s = crnd_new_array<unsigned_int>(uVar13);
        this->m_lookup = __s;
        if (__s == (uint *)0x0) goto LAB_0010eb23;
      }
      else {
        __s = this->m_lookup;
      }
      memset(__s,0xff,4L << ((byte)in_ECX & 0x3f));
      for (uVar6 = 1; uVar6 != in_ECX + 1; uVar6 = uVar6 + 1) {
        if (num_codes[uVar6] != 0) {
          uVar13 = this->m_max_codes[uVar6 - 1];
          uVar12 = min_codes[uVar6 - 1];
          puVar3 = this->m_sorted_symbol_order;
          iVar15 = this->m_max_codes[uVar6 + 0x10] - uVar12;
          bVar8 = (char)uVar9 - (char)uVar6;
          for (; (uVar13 == 0 || (uVar12 <= uVar13 - 1 >> (0x10U - (char)uVar6 & 0x1f)));
              uVar12 = uVar12 + 1) {
            uVar2 = puVar3[iVar15 + uVar12];
            puVar4 = this->m_lookup;
            for (uVar14 = 0; uVar14 >> (bVar8 & 0x1f) == 0; uVar14 = uVar14 + 1) {
              puVar4[uVar14 + (uVar12 << (bVar8 & 0x1f))] = (uint)uVar2 | (int)uVar6 << 0x10;
            }
          }
        }
      }
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      this->m_val_ptrs[lVar10] = this->m_val_ptrs[lVar10] - min_codes[lVar10];
    }
    this->m_table_max_code = 0;
    this->m_decode_start_code_size = (uint)this->m_min_code_size;
    if (uVar5 < in_ECX) {
      do {
        uVar5 = in_ECX - 1;
        if (in_ECX == 0) goto LAB_0010ee08;
        uVar6 = (ulong)in_ECX;
        in_ECX = uVar5;
      } while (num_codes[uVar6] == 0);
      this->m_table_max_code = this->m_max_codes[uVar5];
      uVar9 = uVar9 + 1;
      this->m_decode_start_code_size = uVar9;
      for (; uVar9 <= uVar16; uVar9 = uVar9 + 1) {
        if (num_codes[uVar9] != 0) {
          this->m_decode_start_code_size = uVar9;
          break;
        }
      }
    }
LAB_0010ee08:
    this->m_max_codes[0x10] = 0xffffffff;
    this->m_val_ptrs[0x10] = 0xfffff;
    uVar13 = 0x20 - this->m_table_bits;
    this->m_table_shift = uVar13;
    iVar15 = (int)CONCAT71((uint7)(uint3)(uVar13 >> 8),1);
  }
  else {
LAB_0010eb23:
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits)
        {
            uint32 min_codes[cMaxExpectedCodeSize];
            if ((!num_syms) || (table_bits > cMaxTableBits))
                return false;

            m_num_syms = num_syms;

            uint32 num_codes[cMaxExpectedCodeSize + 1];
            utils::zero_object(num_codes);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                    num_codes[c]++;
            }

            uint32 sorted_positions[cMaxExpectedCodeSize + 1];

            uint32 cur_code = 0;

            uint32 total_used_syms = 0;
            uint32 max_code_size = 0;
            uint32 min_code_size = cUINT32_MAX;
            for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++)
            {
                const uint32 n = num_codes[i];

                if (!n)
                    m_max_codes[i - 1] = 0; //UINT_MAX;
                else
                {
                    min_code_size = math::minimum(min_code_size, i);
                    max_code_size = math::maximum(max_code_size, i);

                    min_codes[i - 1] = cur_code;

                    m_max_codes[i - 1] = cur_code + n - 1;
                    m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

                    m_val_ptrs[i - 1] = total_used_syms;

                    sorted_positions[i] = total_used_syms;

                    cur_code += n;
                    total_used_syms += n;
                }

                cur_code <<= 1;
            }

            m_total_used_syms = total_used_syms;

            if (total_used_syms > m_cur_sorted_symbol_order_size)
            {
                m_cur_sorted_symbol_order_size = total_used_syms;

                if (!math::is_power_of_2(total_used_syms))
                    m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

                if (m_sorted_symbol_order)
                    crnd_delete_array(m_sorted_symbol_order);

                m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                if (!m_sorted_symbol_order)
                    return false;
            }

            m_min_code_size = static_cast<uint8>(min_code_size);
            m_max_code_size = static_cast<uint8>(max_code_size);

            for (uint32 i = 0; i < num_syms; i++)
            {
                uint32 c = pCodesizes[i];
                if (c)
                {
                    CRND_ASSERT(num_codes[c]);

                    uint32 sorted_pos = sorted_positions[c]++;

                    CRND_ASSERT(sorted_pos < total_used_syms);

                    m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
                }
            }

            if (table_bits <= m_min_code_size)
                table_bits = 0;
            m_table_bits = table_bits;

            if (table_bits)
            {
                uint32 table_size = 1 << table_bits;
                if (table_size > m_cur_lookup_size)
                {
                    m_cur_lookup_size = table_size;

                    if (m_lookup)
                        crnd_delete_array(m_lookup);

                    m_lookup = crnd_new_array<uint32>(table_size);
                    if (!m_lookup)
                        return false;
                }

                memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

                for (uint32 codesize = 1; codesize <= table_bits; codesize++)
                {
                    if (!num_codes[codesize])
                        continue;

                    const uint32 fillsize = table_bits - codesize;
                    const uint32 fillnum = 1 << fillsize;

                    const uint32 min_code = min_codes[codesize - 1];
                    const uint32 max_code = get_unshifted_max_code(codesize);
                    const uint32 val_ptr = m_val_ptrs[codesize - 1];

                    for (uint32 code = min_code; code <= max_code; code++)
                    {
                        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
                        CRND_ASSERT(pCodesizes[sym_index] == codesize);

                        for (uint32 j = 0; j < fillnum; j++)
                        {
                            const uint32 t = j + (code << fillsize);

                            CRND_ASSERT(t < (1U << table_bits));

                            CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

                            m_lookup[t] = sym_index | (codesize << 16U);
                        }
                    }
                }
            }

            for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
                m_val_ptrs[i] -= min_codes[i];

            m_table_max_code = 0;
            m_decode_start_code_size = m_min_code_size;

            if (table_bits)
            {
                uint32 i;
                for (i = table_bits; i >= 1; i--)
                {
                    if (num_codes[i])
                    {
                        m_table_max_code = m_max_codes[i - 1];
                        break;
                    }
                }
                if (i >= 1)
                {
                    m_decode_start_code_size = table_bits + 1;
                    for (uint32 j = table_bits + 1; j <= max_code_size; j++)
                    {
                        if (num_codes[j])
                        {
                            m_decode_start_code_size = j;
                            break;
                        }
                    }
                }
            }

            // sentinels
            m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
            m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

            m_table_shift = 32 - m_table_bits;
            return true;
        }